

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromEdge(ON_SubDEdge *e)

{
  ON_SubDEdgeTag etag;
  uint edge_id;
  ON_SubDEdgeSharpness sharpness;
  ON_SubDEdge *e_local;
  ON_SubD_ComponentIdTypeAndTag itt;
  
  if (e == (ON_SubDEdge *)0x0) {
    _e_local = (ON_SubD_ComponentIdTypeAndTag)ZEXT816((ulong)(float  [2])0x0);
  }
  else {
    edge_id = (e->super_ON_SubDComponentBase).m_id;
    etag = e->m_edge_tag;
    sharpness = ON_SubDEdge::Sharpness(e,false);
    _e_local = CreateFromEdgeId(edge_id,etag,sharpness);
  }
  return _e_local;
}

Assistant:

const ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromEdge(const ON_SubDEdge * e)
{
  ON_SubD_ComponentIdTypeAndTag itt
    = (nullptr != e) 
    ? ON_SubD_ComponentIdTypeAndTag::CreateFromEdgeId(e->m_id, e->m_edge_tag, e->Sharpness(false)) 
    : ON_SubD_ComponentIdTypeAndTag::Unset;
  //if (itt.m_id > 0)
  //  itt.m_cptr = ON_SubDComponentPtr::Create(e);
  return itt;
}